

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<MakefileGenerator::Compiler>::
emplace<MakefileGenerator::Compiler_const&>
          (QMovableArrayOps<MakefileGenerator::Compiler> *this,qsizetype i,Compiler *args)

{
  Compiler **ppCVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_70;
  Compiler local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
           super_QArrayDataPointer<MakefileGenerator::Compiler>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
        super_QArrayDataPointer<MakefileGenerator::Compiler>.size == i) {
      qVar4 = QArrayDataPointer<MakefileGenerator::Compiler>::freeSpaceAtEnd
                        ((QArrayDataPointer<MakefileGenerator::Compiler> *)this);
      if (qVar4 == 0) goto LAB_0015e99a;
      MakefileGenerator::Compiler::Compiler
                ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                 super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr +
                 (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                 super_QArrayDataPointer<MakefileGenerator::Compiler>.size,args);
LAB_0015ea85:
      pqVar2 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                super_QArrayDataPointer<MakefileGenerator::Compiler>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0015ea44;
    }
LAB_0015e99a:
    if (i == 0) {
      qVar4 = QArrayDataPointer<MakefileGenerator::Compiler>::freeSpaceAtBegin
                        ((QArrayDataPointer<MakefileGenerator::Compiler> *)this);
      if (qVar4 != 0) {
        MakefileGenerator::Compiler::Compiler
                  ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                   super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr + -1,args);
        ppCVar1 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                   super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
        *ppCVar1 = *ppCVar1 + -1;
        goto LAB_0015ea85;
      }
    }
  }
  local_48.variable_in.d.size = -0x5555555555555556;
  local_48.flags = 0xaaaaaaaa;
  local_48.type = 0xaaaaaaaa;
  local_48.variable_in.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.variable_in.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  MakefileGenerator::Compiler::Compiler(&local_48,args);
  bVar5 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
          super_QArrayDataPointer<MakefileGenerator::Compiler>.size != 0;
  QArrayDataPointer<MakefileGenerator::Compiler>::detachAndGrow
            ((QArrayDataPointer<MakefileGenerator::Compiler> *)this,(uint)(i == 0 && bVar5),1,
             (Compiler **)0x0,(QArrayDataPointer<MakefileGenerator::Compiler> *)0x0);
  if (i == 0 && bVar5) {
    MakefileGenerator::Compiler::Compiler
              ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
               super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr + -1,&local_48);
    ppCVar1 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
               super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
    *ppCVar1 = *ppCVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
              super_QArrayDataPointer<MakefileGenerator::Compiler>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<MakefileGenerator::Compiler> *)this,i,1);
    MakefileGenerator::Compiler::Compiler(local_70.displaceFrom,&local_48);
    local_70.displaceFrom = local_70.displaceFrom + 1;
    (local_70.data)->size = (local_70.data)->size + local_70.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
LAB_0015ea44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }